

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  int *piVar1;
  double *pdVar2;
  double dVar3;
  pointer pdVar4;
  pointer piVar5;
  ulong uVar6;
  long lVar7;
  ulong __n;
  pointer ppVar8;
  initializer_list<int> __l;
  initializer_list<double> __l_00;
  initializer_list<std::pair<int,_double>_> __l_01;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> expectedZip;
  vector<double,_std::allocator<double>_> test2;
  vector<int,_std::allocator<int>_> test1;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> outputZip;
  allocator_type local_91;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> local_90;
  vector<double,_std::allocator<double>_> local_78;
  vector<int,_std::allocator<int>_> local_60;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> local_48;
  undefined8 local_30;
  undefined4 local_28;
  undefined8 local_20;
  
  local_48.super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x300000001;
  local_48.super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x3200000022;
  __l._M_len = 4;
  __l._M_array = (iterator)&local_48;
  std::vector<int,_std::allocator<int>_>::vector(&local_60,__l,(allocator_type *)&local_78);
  local_48.super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x3ff0000000000000;
  local_48.super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x4000000000000000;
  local_48.super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x4008000000000000;
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)&local_48;
  std::vector<double,_std::allocator<double>_>::vector(&local_78,__l_00,(allocator_type *)&local_90)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Test zip...",0xb);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
  std::ostream::put('`');
  std::ostream::flush();
  local_48.super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_48.
                         super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,1);
  local_48.super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x3ff0000000000000;
  local_48.super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)CONCAT44(local_48.
                         super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,3);
  local_30 = 0x4000000000000000;
  local_28 = 0x22;
  local_20 = 0x4008000000000000;
  __l_01._M_len = 3;
  __l_01._M_array = (iterator)&local_48;
  std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::vector
            (&local_90,__l_01,&local_91);
  piVar5 = local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pdVar4 = local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar6 = (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start >> 2;
  __n = (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start >> 3;
  if (uVar6 <= __n) {
    __n = uVar6;
  }
  std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::vector
            (&local_48,__n,&local_91);
  if (local_48.super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_48.super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    lVar7 = 0;
    do {
      dVar3 = *(double *)((long)pdVar4 + lVar7 * 2);
      piVar1 = &(local_48.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->first + lVar7;
      *piVar1 = *(int *)((long)piVar5 + lVar7);
      *(double *)(piVar1 + 2) = dVar3;
      lVar7 = lVar7 + 4;
    } while ((pointer)(piVar1 + 4) !=
             local_48.
             super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  if ((long)local_90.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)local_90.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_start ==
      (long)local_48.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)local_48.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_start) {
    if (local_90.
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_start !=
        local_90.
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_finish) {
      lVar7 = 0;
      do {
        if (((*(int *)((long)&(local_90.
                               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->first + lVar7) !=
              *(int *)((long)&(local_48.
                               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->first + lVar7)) ||
            (dVar3 = *(double *)
                      ((long)&(local_90.
                               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->second + lVar7),
            pdVar2 = (double *)
                     ((long)&(local_48.
                              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->second + lVar7),
            dVar3 != *pdVar2)) || (NAN(dVar3) || NAN(*pdVar2))) goto LAB_001024b4;
        ppVar8 = (pointer)((long)&local_90.
                                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[1].first + lVar7);
        lVar7 = lVar7 + 0x10;
      } while (ppVar8 != local_90.
                         super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"passed!",7);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
    std::ostream::put('`');
    std::ostream::flush();
    if (local_48.
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_90.
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_90.
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    return 0;
  }
LAB_001024b4:
  __assert_fail("expectedZip==outputZip",
                "/workspace/llm4binary/github/license_all_cmakelists_25/drugilsberg[P]functional-cpp/test/zip/main.cpp"
                ,0x18,"int main()");
}

Assistant:

int main(){

    
  
  vector<int> test1={1, 3, 34, 50};
  vector<double> test2={1.0, 2.0, 3.0};

  cout << "Test zip..." << endl;
  vector< pair<int,double> > expectedZip={
      make_pair(1,1.0),
      make_pair(3,2.0),
      make_pair(34, 3.0)      
  };
  auto outputZip = Functional::zip(test1, test2);  
  assert( expectedZip==outputZip);
  cout << "passed!" << endl;

  return 0;

}